

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O1

Matrix44<double> * __thiscall
Imath_2_5::Matrix44<double>::rotate<double>(Matrix44<double> *this,Vec3<double> *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  dVar9 = cos(r->z);
  dVar10 = cos(r->y);
  dVar11 = cos(r->x);
  dVar12 = sin(r->z);
  dVar13 = sin(r->y);
  dVar14 = sin(r->x);
  dVar19 = dVar9 * dVar10;
  dVar20 = dVar10 * dVar12;
  dVar16 = dVar9 * dVar13 * dVar14 - dVar12 * dVar11;
  dVar18 = dVar9 * dVar11 + dVar12 * dVar13 * dVar14;
  dVar17 = dVar10 * dVar14;
  dVar21 = dVar12 * dVar14 + dVar11 * dVar9 * dVar13;
  dVar15 = dVar11 * dVar12 * dVar13 - dVar9 * dVar14;
  dVar10 = dVar10 * dVar11;
  dVar9 = this->x[2][0];
  dVar11 = this->x[2][1];
  dVar12 = this->x[0][0];
  dVar14 = this->x[0][1];
  dVar1 = this->x[0][2];
  dVar2 = this->x[0][3];
  dVar3 = this->x[1][0];
  dVar4 = this->x[1][1];
  dVar5 = this->x[1][2];
  dVar6 = this->x[1][3];
  this->x[0][0] = (dVar12 * dVar19 + dVar20 * dVar3) - dVar9 * dVar13;
  this->x[0][1] = (dVar14 * dVar19 + dVar20 * dVar4) - dVar11 * dVar13;
  dVar7 = this->x[2][2];
  dVar8 = this->x[2][3];
  this->x[0][2] = (dVar19 * dVar1 + dVar20 * dVar5) - dVar13 * dVar7;
  this->x[0][3] = (dVar19 * dVar2 + dVar20 * dVar6) - dVar13 * dVar8;
  this->x[1][0] = dVar9 * dVar17 + dVar12 * dVar16 + dVar18 * dVar3;
  this->x[1][1] = dVar11 * dVar17 + dVar14 * dVar16 + dVar18 * dVar4;
  this->x[1][2] = dVar17 * dVar7 + dVar16 * dVar1 + dVar18 * dVar5;
  this->x[1][3] = dVar17 * dVar8 + dVar16 * dVar2 + dVar18 * dVar6;
  this->x[2][0] = dVar9 * dVar10 + dVar12 * dVar21 + dVar3 * dVar15;
  this->x[2][1] = dVar11 * dVar10 + dVar14 * dVar21 + dVar4 * dVar15;
  this->x[2][2] = dVar10 * dVar7 + dVar21 * dVar1 + dVar15 * dVar5;
  this->x[2][3] = dVar10 * dVar8 + dVar21 * dVar2 + dVar15 * dVar6;
  return this;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::rotate (const Vec3<S> &r)
{
    S cos_rz, sin_rz, cos_ry, sin_ry, cos_rx, sin_rx;
    S m00, m01, m02;
    S m10, m11, m12;
    S m20, m21, m22;

    cos_rz = Math<S>::cos (r[2]);
    cos_ry = Math<S>::cos (r[1]);
    cos_rx = Math<S>::cos (r[0]);
    
    sin_rz = Math<S>::sin (r[2]);
    sin_ry = Math<S>::sin (r[1]);
    sin_rx = Math<S>::sin (r[0]);

    m00 =  cos_rz *  cos_ry;
    m01 =  sin_rz *  cos_ry;
    m02 = -sin_ry;
    m10 = -sin_rz *  cos_rx + cos_rz * sin_ry * sin_rx;
    m11 =  cos_rz *  cos_rx + sin_rz * sin_ry * sin_rx;
    m12 =  cos_ry *  sin_rx;
    m20 = -sin_rz * -sin_rx + cos_rz * sin_ry * cos_rx;
    m21 =  cos_rz * -sin_rx + sin_rz * sin_ry * cos_rx;
    m22 =  cos_ry *  cos_rx;

    Matrix44<T> P (*this);

    x[0][0] = P[0][0] * m00 + P[1][0] * m01 + P[2][0] * m02;
    x[0][1] = P[0][1] * m00 + P[1][1] * m01 + P[2][1] * m02;
    x[0][2] = P[0][2] * m00 + P[1][2] * m01 + P[2][2] * m02;
    x[0][3] = P[0][3] * m00 + P[1][3] * m01 + P[2][3] * m02;

    x[1][0] = P[0][0] * m10 + P[1][0] * m11 + P[2][0] * m12;
    x[1][1] = P[0][1] * m10 + P[1][1] * m11 + P[2][1] * m12;
    x[1][2] = P[0][2] * m10 + P[1][2] * m11 + P[2][2] * m12;
    x[1][3] = P[0][3] * m10 + P[1][3] * m11 + P[2][3] * m12;

    x[2][0] = P[0][0] * m20 + P[1][0] * m21 + P[2][0] * m22;
    x[2][1] = P[0][1] * m20 + P[1][1] * m21 + P[2][1] * m22;
    x[2][2] = P[0][2] * m20 + P[1][2] * m21 + P[2][2] * m22;
    x[2][3] = P[0][3] * m20 + P[1][3] * m21 + P[2][3] * m22;

    return *this;
}